

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# visitor.h
# Opt level: O0

void __thiscall
Fixpp::impl::FieldParser<Fixpp::FieldRef<Fixpp::TagT<176u,Fixpp::Type::String>>>::
parse<Fixpp::impl::TagSet<Fixpp::VersionnedMessageRef<Fixpp::v42::Version,Fixpp::Chars<(char)84>,Fixpp::Required<Fixpp::TagT<162u,Fixpp::Type::String>>,Fixpp::Required<Fixpp::TagT<163u,Fixpp::Type::Char>>,Fixpp::Required<Fixpp::TagT<214u,Fixpp::Type::String>>,Fixpp::Required<Fixpp::TagT<160u,Fixpp::Type::Char>>,Fixpp::Required<Fixpp::TagT<165u,Fixpp::Type::Char>>,Fixpp::Required<Fixpp::TagT<79u,Fixpp::Type::String>>,Fixpp::TagT<166u,Fixpp::Type::String>,Fixpp::TagT<75u,Fixpp::Type::String>,Fixpp::TagT<70u,Fixpp::Type::String>,Fixpp::TagT<30u,Fixpp::Type::String>,Fixpp::TagT<336u,Fixpp::Type::String>,Fixpp::TagT<54u,Fixpp::Type::Char>,Fixpp::TagT<167u,Fixpp::Type::String>,Fixpp::TagT<168u,Fixpp::Type::UTCTimestamp>,Fixpp::Required<Fixpp::TagT<60u,Fixpp::Type::UTCTimestamp>>,Fixpp::TagT<109u,Fixpp::Type::String>,Fixpp::TagT<76u,Fixpp::Type::String>,Fixpp::TagT<169u,Fixpp::Type::Int>,Fixpp::TagT<170u,Fixpp::Type::String>,Fixpp::TagT<171u,Fixpp::Type::String>,Fixpp::TagT<172u,Fixpp::Type::Int>,Fixpp::TagT<173u,Fixpp::Type::String>,Fixpp::TagT<174u,Fixpp::Type::String>,Fixpp::TagT<175u,Fixpp::Type::String>,Fixpp::TagT<176u,Fixpp::Type::String>,Fixpp::TagT<177u,Fixpp::Type::String>,Fixpp::TagT<178u,Fixpp::Type::String>,Fixpp::TagT<179u,Fixpp::Type::String>,Fixpp::TagT<180u,Fixpp::Type::String>,Fixpp::TagT<181u,Fixpp::Type::String>,Fixpp::TagT<182u,Fixpp::Type::String>,Fixpp::TagT<183u,Fixpp::Type::String>,Fixpp::TagT<184u,Fixpp::Type::String>,Fixpp::TagT<185u,Fixpp::Type::String>,Fixpp::TagT<186u,Fixpp::Type::String>,Fixpp::TagT<187u,Fixpp::Type::String>>>>
          (FieldParser<Fixpp::FieldRef<Fixpp::TagT<176u,Fixpp::Type::String>>> *this,Field *field,
          ParsingContext *context,
          TagSet<Fixpp::VersionnedMessageRef<Fixpp::v42::Version,_Fixpp::Chars<_T_>,_Fixpp::Required<Fixpp::TagT<162U,_Fixpp::Type::String>_>,_Fixpp::Required<Fixpp::TagT<163U,_Fixpp::Type::Char>_>,_Fixpp::Required<Fixpp::TagT<214U,_Fixpp::Type::String>_>,_Fixpp::Required<Fixpp::TagT<160U,_Fixpp::Type::Char>_>,_Fixpp::Required<Fixpp::TagT<165U,_Fixpp::Type::Char>_>,_Fixpp::Required<Fixpp::TagT<79U,_Fixpp::Type::String>_>,_Fixpp::TagT<166U,_Fixpp::Type::String>,_Fixpp::TagT<75U,_Fixpp::Type::String>,_Fixpp::TagT<70U,_Fixpp::Type::String>,_Fixpp::TagT<30U,_Fixpp::Type::String>,_Fixpp::TagT<336U,_Fixpp::Type::String>,_Fixpp::TagT<54U,_Fixpp::Type::Char>,_Fixpp::TagT<167U,_Fixpp::Type::String>,_Fixpp::TagT<168U,_Fixpp::Type::UTCTimestamp>,_Fixpp::Required<Fixpp::TagT<60U,_Fixpp::Type::UTCTimestamp>_>,_Fixpp::TagT<109U,_Fixpp::Type::String>,_Fixpp::TagT<76U,_Fixpp::Type::String>,_Fixpp::TagT<169U,_Fixpp::Type::Int>,_Fixpp::TagT<170U,_Fixpp::Type::String>,_Fixpp::TagT<171U,_Fixpp::Type::String>,_Fixpp::TagT<172U,_Fixpp::Type::Int>,_Fixpp::TagT<173U,_Fixpp::Type::String>,_Fixpp::TagT<174U,_Fixpp::Type::String>,_Fixpp::TagT<175U,_Fixpp::Type::String>,_Fixpp::TagT<176U,_Fixpp::Type::String>,_Fixpp::TagT<177U,_Fixpp::Type::String>,_Fixpp::TagT<178U,_Fixpp::Type::String>,_Fixpp::TagT<179U,_Fixpp::Type::String>,_Fixpp::TagT<180U,_Fixpp::Type::String>,_Fixpp::TagT<181U,_Fixpp::Type::String>,_Fixpp::TagT<182U,_Fixpp::Type::String>,_Fixpp::TagT<183U,_Fixpp::Type::String>,_Fixpp::TagT<184U,_Fixpp::Type::String>,_Fixpp::TagT<185U,_Fixpp::Type::String>,_Fixpp::TagT<186U,_Fixpp::Type::String>,_Fixpp::TagT<187U,_Fixpp::Type::String>_>_>
          *tagSet,bool param_4,bool param_5)

{
  StreamCursor *cursor_00;
  bool bVar1;
  uint tag;
  undefined1 local_70 [8];
  pair<const_char_*,_unsigned_long> view;
  Token valueToken;
  StreamCursor *cursor;
  bool param_5_local;
  bool param_4_local;
  TagSet<Fixpp::VersionnedMessageRef<Fixpp::v42::Version,_Fixpp::Chars<_T_>,_Fixpp::Required<Fixpp::TagT<162U,_Fixpp::Type::String>_>,_Fixpp::Required<Fixpp::TagT<163U,_Fixpp::Type::Char>_>,_Fixpp::Required<Fixpp::TagT<214U,_Fixpp::Type::String>_>,_Fixpp::Required<Fixpp::TagT<160U,_Fixpp::Type::Char>_>,_Fixpp::Required<Fixpp::TagT<165U,_Fixpp::Type::Char>_>,_Fixpp::Required<Fixpp::TagT<79U,_Fixpp::Type::String>_>,_Fixpp::TagT<166U,_Fixpp::Type::String>,_Fixpp::TagT<75U,_Fixpp::Type::String>,_Fixpp::TagT<70U,_Fixpp::Type::String>,_Fixpp::TagT<30U,_Fixpp::Type::String>,_Fixpp::TagT<336U,_Fixpp::Type::String>,_Fixpp::TagT<54U,_Fixpp::Type::Char>,_Fixpp::TagT<167U,_Fixpp::Type::String>,_Fixpp::TagT<168U,_Fixpp::Type::UTCTimestamp>,_Fixpp::Required<Fixpp::TagT<60U,_Fixpp::Type::UTCTimestamp>_>,_Fixpp::TagT<109U,_Fixpp::Type::String>,_Fixpp::TagT<76U,_Fixpp::Type::String>,_Fixpp::TagT<169U,_Fixpp::Type::Int>,_Fixpp::TagT<170U,_Fixpp::Type::String>,_Fixpp::TagT<171U,_Fixpp::Type::String>,_Fixpp::TagT<172U,_Fixpp::Type::Int>,_Fixpp::TagT<173U,_Fixpp::Type::String>,_Fixpp::TagT<174U,_Fixpp::Type::String>,_Fixpp::TagT<175U,_Fixpp::Type::String>,_Fixpp::TagT<176U,_Fixpp::Type::String>,_Fixpp::TagT<177U,_Fixpp::Type::String>,_Fixpp::TagT<178U,_Fixpp::Type::String>,_Fixpp::TagT<179U,_Fixpp::Type::String>,_Fixpp::TagT<180U,_Fixpp::Type::String>,_Fixpp::TagT<181U,_Fixpp::Type::String>,_Fixpp::TagT<182U,_Fixpp::Type::String>,_Fixpp::TagT<183U,_Fixpp::Type::String>,_Fixpp::TagT<184U,_Fixpp::Type::String>,_Fixpp::TagT<185U,_Fixpp::Type::String>,_Fixpp::TagT<186U,_Fixpp::Type::String>,_Fixpp::TagT<187U,_Fixpp::Type::String>_>_>
  *tagSet_local;
  ParsingContext *context_local;
  Field *field_local;
  FieldParser<Fixpp::FieldRef<Fixpp::TagT<176U,_Fixpp::Type::String>_>_> *this_local;
  
  cursor_00 = context->cursor;
  StreamCursor::Token::Token((Token *)&view.second,context->cursor);
  bVar1 = match_until_fast('|',cursor_00);
  if (bVar1) {
    _local_70 = StreamCursor::Token::view((Token *)&view.second);
    bVar1 = StreamCursor::advance(cursor_00,1);
    if (bVar1) {
      FieldRef<Fixpp::TagT<176U,_Fixpp::Type::String>_>::set(field,(View *)local_70);
      tag = FieldRef<Fixpp::TagT<176U,_Fixpp::Type::String>_>::tag(field);
      TagSet<Fixpp::Required<Fixpp::TagT<162U,_Fixpp::Type::String>_>,_Fixpp::Required<Fixpp::TagT<163U,_Fixpp::Type::Char>_>,_Fixpp::Required<Fixpp::TagT<214U,_Fixpp::Type::String>_>,_Fixpp::Required<Fixpp::TagT<160U,_Fixpp::Type::Char>_>,_Fixpp::Required<Fixpp::TagT<165U,_Fixpp::Type::Char>_>,_Fixpp::Required<Fixpp::TagT<79U,_Fixpp::Type::String>_>,_Fixpp::TagT<166U,_Fixpp::Type::String>,_Fixpp::TagT<75U,_Fixpp::Type::String>,_Fixpp::TagT<70U,_Fixpp::Type::String>,_Fixpp::TagT<30U,_Fixpp::Type::String>,_Fixpp::TagT<336U,_Fixpp::Type::String>,_Fixpp::TagT<54U,_Fixpp::Type::Char>,_Fixpp::TagT<167U,_Fixpp::Type::String>,_Fixpp::TagT<168U,_Fixpp::Type::UTCTimestamp>,_Fixpp::Required<Fixpp::TagT<60U,_Fixpp::Type::UTCTimestamp>_>,_Fixpp::TagT<109U,_Fixpp::Type::String>,_Fixpp::TagT<76U,_Fixpp::Type::String>,_Fixpp::TagT<169U,_Fixpp::Type::Int>,_Fixpp::TagT<170U,_Fixpp::Type::String>,_Fixpp::TagT<171U,_Fixpp::Type::String>,_Fixpp::TagT<172U,_Fixpp::Type::Int>,_Fixpp::TagT<173U,_Fixpp::Type::String>,_Fixpp::TagT<174U,_Fixpp::Type::String>,_Fixpp::TagT<175U,_Fixpp::Type::String>,_Fixpp::TagT<176U,_Fixpp::Type::String>,_Fixpp::TagT<177U,_Fixpp::Type::String>,_Fixpp::TagT<178U,_Fixpp::Type::String>,_Fixpp::TagT<179U,_Fixpp::Type::String>,_Fixpp::TagT<180U,_Fixpp::Type::String>,_Fixpp::TagT<181U,_Fixpp::Type::String>,_Fixpp::TagT<182U,_Fixpp::Type::String>,_Fixpp::TagT<183U,_Fixpp::Type::String>,_Fixpp::TagT<184U,_Fixpp::Type::String>,_Fixpp::TagT<185U,_Fixpp::Type::String>,_Fixpp::TagT<186U,_Fixpp::Type::String>,_Fixpp::TagT<187U,_Fixpp::Type::String>_>
      ::set(&tagSet->
             super_TagSet<Fixpp::Required<Fixpp::TagT<162U,_Fixpp::Type::String>_>,_Fixpp::Required<Fixpp::TagT<163U,_Fixpp::Type::Char>_>,_Fixpp::Required<Fixpp::TagT<214U,_Fixpp::Type::String>_>,_Fixpp::Required<Fixpp::TagT<160U,_Fixpp::Type::Char>_>,_Fixpp::Required<Fixpp::TagT<165U,_Fixpp::Type::Char>_>,_Fixpp::Required<Fixpp::TagT<79U,_Fixpp::Type::String>_>,_Fixpp::TagT<166U,_Fixpp::Type::String>,_Fixpp::TagT<75U,_Fixpp::Type::String>,_Fixpp::TagT<70U,_Fixpp::Type::String>,_Fixpp::TagT<30U,_Fixpp::Type::String>,_Fixpp::TagT<336U,_Fixpp::Type::String>,_Fixpp::TagT<54U,_Fixpp::Type::Char>,_Fixpp::TagT<167U,_Fixpp::Type::String>,_Fixpp::TagT<168U,_Fixpp::Type::UTCTimestamp>,_Fixpp::Required<Fixpp::TagT<60U,_Fixpp::Type::UTCTimestamp>_>,_Fixpp::TagT<109U,_Fixpp::Type::String>,_Fixpp::TagT<76U,_Fixpp::Type::String>,_Fixpp::TagT<169U,_Fixpp::Type::Int>,_Fixpp::TagT<170U,_Fixpp::Type::String>,_Fixpp::TagT<171U,_Fixpp::Type::String>,_Fixpp::TagT<172U,_Fixpp::Type::Int>,_Fixpp::TagT<173U,_Fixpp::Type::String>,_Fixpp::TagT<174U,_Fixpp::Type::String>,_Fixpp::TagT<175U,_Fixpp::Type::String>,_Fixpp::TagT<176U,_Fixpp::Type::String>,_Fixpp::TagT<177U,_Fixpp::Type::String>,_Fixpp::TagT<178U,_Fixpp::Type::String>,_Fixpp::TagT<179U,_Fixpp::Type::String>,_Fixpp::TagT<180U,_Fixpp::Type::String>,_Fixpp::TagT<181U,_Fixpp::Type::String>,_Fixpp::TagT<182U,_Fixpp::Type::String>,_Fixpp::TagT<183U,_Fixpp::Type::String>,_Fixpp::TagT<184U,_Fixpp::Type::String>,_Fixpp::TagT<185U,_Fixpp::Type::String>,_Fixpp::TagT<186U,_Fixpp::Type::String>,_Fixpp::TagT<187U,_Fixpp::Type::String>_>
            ,tag);
    }
    else {
      ParsingContext::setError(context,Incomplete,"Expected value after tag \'%d\', got EOF",0xb0);
    }
  }
  else {
    ParsingContext::setError(context,ParsingError,"Expected value tag \'%d\', got EOF",0xb0);
  }
  return;
}

Assistant:

void parse(Field& field, ParsingContext& context, TagSet& tagSet, bool /* strict */, bool /* skipUnknown */)
            {
                auto& cursor = context.cursor;
                // @Todo: In Strict mode, validate the type of the Tag
                StreamCursor::Token valueToken(context.cursor);
                TRY_MATCH_UNTIL(SOH, "Expected value tag '%d', got EOF", TagT::Id);

                auto view = valueToken.view();
                TRY_ADVANCE("Expected value after tag '%d', got EOF", TagT::Id);

                field.set(view);
                tagSet.set(field.tag());
            }